

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void clip_image_u8_free(clip_image_u8 *img)

{
  void *in_RDI;
  
  if ((in_RDI != (void *)0x0) && (in_RDI != (void *)0x0)) {
    clip_image_u8::~clip_image_u8((clip_image_u8 *)0x1608bb);
    operator_delete(in_RDI,0x20);
  }
  return;
}

Assistant:

void clip_image_u8_free(struct clip_image_u8  * img) { if (img) delete img; }